

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

uint anon_unknown.dwarf_b837c::AllocateVariableInScope
               (ExpressionContext *ctx,SynBase *source,uint alignment,longlong size)

{
  ScopeData *pSVar1;
  ScopeData *pSVar2;
  ulong uVar3;
  uint uVar4;
  
  if ((0x10 < alignment) ||
     (uVar4 = alignment - (alignment >> 1 & 0x55555555),
     uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333),
     1 < ((uVar4 >> 4) + uVar4 & 0xf0f0f0f) * 0x1010101 >> 0x18)) {
    __assert_fail("(alignment & (alignment - 1)) == 0 && alignment <= 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x1ac,
                  "unsigned int (anonymous namespace)::AllocateVariableInScope(ExpressionContext &, SynBase *, unsigned int, long long)"
                 );
  }
  pSVar1 = ctx->scope;
  while( true ) {
    pSVar2 = pSVar1;
    if (pSVar2->scope == (ScopeData *)0x0) {
      if (pSVar2 == ctx->globalScope) {
        uVar4 = AllocateGlobalVariable(ctx,source,alignment,size);
        return uVar4;
      }
      __assert_fail("scope == ctx.globalScope",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x1db,
                    "unsigned int (anonymous namespace)::AllocateVariableInScope(ExpressionContext &, SynBase *, unsigned int, long long)"
                   );
    }
    if (pSVar2->type == SCOPE_TEMPORARY) {
      uVar3 = 0;
      goto LAB_0017c46d;
    }
    if (pSVar2->ownerFunction != (FunctionData *)0x0) break;
    pSVar1 = pSVar2->scope;
    if (pSVar2->ownerType != (TypeBase *)0x0) {
      uVar4 = GetAlignmentOffset(pSVar2->dataSize,alignment);
      uVar3 = (ulong)uVar4 + pSVar2->dataSize;
      pSVar2->dataSize = uVar3;
      if (0x1000000 < (long)((uVar3 & 0xffffffff) + size)) {
LAB_0017c498:
        ExpressionContext::Stop(ctx,source,"ERROR: variable size limit exceeded");
      }
      pSVar2->dataSize = size + uVar3;
      pSVar2->ownerType->size = size + uVar3;
LAB_0017c46d:
      return (uint)uVar3;
    }
  }
  uVar4 = GetAlignmentOffset(pSVar2->dataSize,alignment);
  uVar3 = (ulong)uVar4 + pSVar2->dataSize;
  pSVar2->dataSize = uVar3;
  if (0x1000000 < (long)((uVar3 & 0xffffffff) + size)) goto LAB_0017c498;
  pSVar2->dataSize = size + uVar3;
  pSVar2->ownerFunction->stackSize = size + uVar3;
  goto LAB_0017c46d;
}

Assistant:

unsigned AllocateVariableInScope(ExpressionContext &ctx, SynBase *source, unsigned alignment, long long size)
	{
		assert((alignment & (alignment - 1)) == 0 && alignment <= 16);

		ScopeData *scope = ctx.scope;

		while(scope->scope)
		{
			// Don't let allocations escape the temporary scope
			if(scope->type == SCOPE_TEMPORARY)
			{
				return 0;
			}

			if(scope->ownerFunction)
			{
				scope->dataSize += GetAlignmentOffset(scope->dataSize, alignment);

				unsigned result = unsigned(scope->dataSize);

				if(result + size > (1 << 24))
					ctx.Stop(source, "ERROR: variable size limit exceeded");

				scope->dataSize += size;

				scope->ownerFunction->stackSize = scope->dataSize;

				return result;
			}

			if(scope->ownerType)
			{
				scope->dataSize += GetAlignmentOffset(scope->dataSize, alignment);

				unsigned result = unsigned(scope->dataSize);

				if(result + size > (1 << 24))
					ctx.Stop(source, "ERROR: variable size limit exceeded");

				scope->dataSize += size;

				scope->ownerType->size = scope->dataSize;

				return result;
			}

			scope = scope->scope;
		}

		assert(scope == ctx.globalScope);

		return AllocateGlobalVariable(ctx, source, alignment, size);
	}